

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BringWindowToDisplayBehind(ImGuiWindow *window,ImGuiWindow *behind_window)

{
  ImGuiWindow *window_00;
  ImGuiWindow *window_01;
  ImGuiContext *pIVar1;
  int iVar2;
  int i;
  ImGuiWindow **ppIVar3;
  size_t copy_bytes_1;
  size_t copy_bytes;
  int pos_beh;
  int pos_wnd;
  ImGuiContext *g;
  ImGuiWindow *behind_window_local;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  if (window == (ImGuiWindow *)0x0 || behind_window == (ImGuiWindow *)0x0) {
    __assert_fail("window != __null && behind_window != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x1a72,"void ImGui::BringWindowToDisplayBehind(ImGuiWindow *, ImGuiWindow *)");
  }
  window_00 = window->RootWindow;
  window_01 = behind_window->RootWindow;
  iVar2 = FindWindowDisplayIndex(window_00);
  i = FindWindowDisplayIndex(window_01);
  if (iVar2 < i) {
    memmove((pIVar1->Windows).Data + iVar2,(pIVar1->Windows).Data + (iVar2 + 1),
            (long)((i - iVar2) + -1) << 3);
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,i + -1);
    *ppIVar3 = window_00;
  }
  else {
    memmove((pIVar1->Windows).Data + (i + 1),(pIVar1->Windows).Data + i,(long)(iVar2 - i) << 3);
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,i);
    *ppIVar3 = window_00;
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayBehind(ImGuiWindow* window, ImGuiWindow* behind_window)
{
    IM_ASSERT(window != NULL && behind_window != NULL);
    ImGuiContext& g = *GImGui;
    window = window->RootWindow;
    behind_window = behind_window->RootWindow;
    int pos_wnd = FindWindowDisplayIndex(window);
    int pos_beh = FindWindowDisplayIndex(behind_window);
    if (pos_wnd < pos_beh)
    {
        size_t copy_bytes = (pos_beh - pos_wnd - 1) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_wnd], &g.Windows.Data[pos_wnd + 1], copy_bytes);
        g.Windows[pos_beh - 1] = window;
    }
    else
    {
        size_t copy_bytes = (pos_wnd - pos_beh) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_beh + 1], &g.Windows.Data[pos_beh], copy_bytes);
        g.Windows[pos_beh] = window;
    }
}